

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.h
# Opt level: O0

void __thiscall StackVector<CMString>::Push(StackVector<CMString> *this,CMString In)

{
  int iVar1;
  CMString *pCVar2;
  StackVector<CMString> *this_local;
  
  if (this->CurSize + 1 < 0x41) {
    iVar1 = this->CurSize;
    this->CurSize = iVar1 + 1;
    pCVar2 = this->Stack + iVar1;
    pCVar2->Str = In.Str;
    pCVar2->Len = In.Len;
    pCVar2->Hash = In.Hash;
  }
  else {
    std::vector<CMString,_std::allocator<CMString>_>::push_back(&this->Heap,&In);
    this->CurSize = this->CurSize + 1;
  }
  return;
}

Assistant:

void Push(T In)
	{
		if (CurSize + 1 > STACKVECTOR_SIZE) {
			Heap.push_back(In);
			CurSize++;
		} else {
			Stack[CurSize++] = In;
		}
	}